

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Gridded_Data_PDU::Encode(Gridded_Data_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference this_00;
  GridAxisRegular *pGVar3;
  reference this_01;
  GridData *pGVar4;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
  local_38;
  const_iterator citrDataEnd;
  const_iterator citrData;
  const_iterator citrAxisEnd;
  const_iterator citrAxis;
  KDataStream *stream_local;
  Gridded_Data_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar2 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_EnvProcID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16FieldNum);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16PDUNum);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16PDUTotal);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16CordSys);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8NumAxis);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8ConstGrid);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_EnvType).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_Ori).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui64SampleTime);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui32TotalValues);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8VecDim);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16Padding1);
  KDataStream::operator<<(pKVar2,this->m_ui8Padding1);
  citrAxisEnd = std::
                vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
                ::begin(&this->m_vpGridAxisDesc);
  citrData._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::GridData> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
       ::end(&this->m_vpGridAxisDesc);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&citrAxisEnd,
                       (__normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
                        *)&citrData);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
              ::operator*(&citrAxisEnd);
    pGVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>::operator->(this_00);
    (*(pGVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pGVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
    ::operator++(&citrAxisEnd);
  }
  citrDataEnd = std::
                vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
                ::begin(&this->m_vGridData);
  local_38._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::GridData> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
       ::end(&this->m_vGridData);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrDataEnd,&local_38);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
              ::operator*(&citrDataEnd);
    pGVar4 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::operator->(this_01);
    (*(pGVar4->super_DataTypeBase)._vptr_DataTypeBase[5])(pGVar4,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
    ::operator++(&citrDataEnd);
  }
  return;
}

Assistant:

void Gridded_Data_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_EnvProcID
           << m_ui16FieldNum
           << m_ui16PDUNum
           << m_ui16PDUTotal
           << m_ui16CordSys
           << m_ui8NumAxis
           << m_ui8ConstGrid
           << KDIS_STREAM m_EnvType
           << KDIS_STREAM m_Ori
           << m_ui64SampleTime
           << m_ui32TotalValues
           << m_ui8VecDim
           << m_ui16Padding1
           << m_ui8Padding1;

    vector<GridAxisDescriptor>::const_iterator citrAxis = m_vpGridAxisDesc.begin();
    vector<GridAxisDescriptor>::const_iterator citrAxisEnd = m_vpGridAxisDesc.end();
    for( ; citrAxis != citrAxisEnd; ++citrAxis )
    {
        ( *citrAxis )->Encode( stream );
    }

    vector<GridDataPtr>::const_iterator citrData = m_vGridData.begin();
    vector<GridDataPtr>::const_iterator citrDataEnd = m_vGridData.end();
    for( ; citrData != citrDataEnd; ++citrData )
    {
        ( *citrData )->Encode( stream );
    }
}